

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perlin.h
# Opt level: O0

double __thiscall perlin::noise(perlin *this,point3 *p)

{
  double *pdVar1;
  vec3 *pvVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  vec3 *local_120;
  int local_114;
  int local_110;
  int dk;
  int dj;
  int di;
  vec3 c [2] [2] [2];
  int k;
  int j;
  int i;
  double w;
  double v;
  double u;
  point3 *p_local;
  perlin *this_local;
  
  dVar3 = vec3::x(p);
  dVar4 = vec3::x(p);
  dVar4 = floor(dVar4);
  dVar5 = vec3::y(p);
  dVar6 = vec3::y(p);
  dVar6 = floor(dVar6);
  dVar7 = vec3::z(p);
  dVar8 = vec3::z(p);
  dVar8 = floor(dVar8);
  dVar9 = vec3::x(p);
  dVar9 = floor(dVar9);
  dVar10 = vec3::y(p);
  dVar10 = floor(dVar10);
  dVar11 = vec3::z(p);
  dVar11 = floor(dVar11);
  local_120 = (vec3 *)&dj;
  do {
    vec3::vec3(local_120);
    local_120 = local_120 + 1;
  } while (local_120 != (vec3 *)(c[1][1][1].e + 2));
  for (dk = 0; dk < 2; dk = dk + 1) {
    for (local_110 = 0; local_110 < 2; local_110 = local_110 + 1) {
      for (local_114 = 0; local_114 < 2; local_114 = local_114 + 1) {
        pvVar2 = this->randvec +
                 (this->perm_x[(int)((int)dVar9 + dk & 0xff)] ^
                  this->perm_y[(int)((int)dVar10 + local_110 & 0xff)] ^
                 this->perm_z[(int)((int)dVar11 + local_114 & 0xff)]);
        pdVar1 = (double *)(&dj + (long)dk * 0x18 + (long)local_110 * 0xc + (long)local_114 * 6);
        *pdVar1 = pvVar2->e[0];
        pdVar1[1] = pvVar2->e[1];
        pdVar1[2] = pvVar2->e[2];
      }
    }
  }
  dVar3 = perlin_interp((vec3 (*) [2] [2])&dj,dVar3 - dVar4,dVar5 - dVar6,dVar7 - dVar8);
  return dVar3;
}

Assistant:

double noise(const point3& p) const {
        auto u = p.x() - std::floor(p.x());
        auto v = p.y() - std::floor(p.y());
        auto w = p.z() - std::floor(p.z());

        auto i = int(std::floor(p.x()));
        auto j = int(std::floor(p.y()));
        auto k = int(std::floor(p.z()));
        vec3 c[2][2][2];

        for (int di=0; di < 2; di++)
            for (int dj=0; dj < 2; dj++)
                for (int dk=0; dk < 2; dk++)
                    c[di][dj][dk] = randvec[
                        perm_x[(i+di) & 255] ^
                        perm_y[(j+dj) & 255] ^
                        perm_z[(k+dk) & 255]
                    ];

        return perlin_interp(c, u, v, w);
    }